

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::on_hex
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  char cVar1;
  basic_format_specs<char> *spec;
  bool bVar2;
  hex_writer f;
  ulong uVar3;
  uint uVar4;
  string_view prefix;
  undefined4 uStack_4;
  
  spec = this->spec;
  if ((spec->flags_ & 8) != 0) {
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = '0';
    cVar1 = spec->type_;
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = cVar1;
  }
  uVar4 = 0;
  uVar3 = this->abs_value;
  do {
    uVar4 = uVar4 + 1;
    bVar2 = 0xf < uVar3;
    uVar3 = uVar3 >> 4;
  } while (bVar2);
  f._12_4_ = uStack_4;
  f.num_digits = uVar4;
  f.self = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              *)this->writer,uVar4,prefix,spec,f);
  return;
}

Assistant:

void on_hex() {
      if (spec.flag(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type());
      }
      unsigned num_digits = count_digits<4>();
      writer.write_int(num_digits, get_prefix(), spec,
                       hex_writer{*this, num_digits});
    }